

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O2

PublicationInfo * __thiscall
helics::InterfaceInfo::getPublication(InterfaceInfo *this,InterfaceHandle handle)

{
  PublicationInfo *pPVar1;
  InterfaceHandle local_2c;
  handle local_28;
  
  local_2c.hid = handle.hid;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock(&local_28,&this->publications);
  pPVar1 = gmlc::containers::
           DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(local_28.data,&local_2c);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_28.m_handle_lock);
  return pPVar1;
}

Assistant:

PublicationInfo* InterfaceInfo::getPublication(InterfaceHandle handle)
{
    return publications.lock()->find(handle);
}